

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QUtil.cc
# Opt level: O1

FILE * QUtil::safe_fopen(char *filename,char *mode)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  long *plVar2;
  FILE *pFVar3;
  undefined8 extraout_RAX;
  size_type *psVar4;
  string local_60;
  long *local_40 [2];
  long local_30 [2];
  
  local_40[0] = local_30;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_40,"open ","");
  plVar2 = (long *)std::__cxx11::string::append((char *)local_40);
  paVar1 = &local_60.field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_60.field_2._M_allocated_capacity = *psVar4;
    local_60.field_2._8_8_ = plVar2[3];
    local_60._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_60.field_2._M_allocated_capacity = *psVar4;
    local_60._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_60._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  pFVar3 = fopen(filename,mode);
  if (pFVar3 != (FILE *)0x0) {
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_60._M_dataplus._M_p != paVar1) {
      operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
    }
    if (local_40[0] != local_30) {
      operator_delete(local_40[0],local_30[0] + 1);
    }
    return (FILE *)pFVar3;
  }
  throw_system_error(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != paVar1) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (local_40[0] != local_30) {
    operator_delete(local_40[0],local_30[0] + 1);
  }
  _Unwind_Resume(extraout_RAX);
}

Assistant:

FILE*
QUtil::safe_fopen(char const* filename, char const* mode)
{
    FILE* f = nullptr;
#ifdef _WIN32
    std::shared_ptr<wchar_t> wfilenamep = win_convert_filename(filename);
    wchar_t* wfilename = wfilenamep.get();
    auto wmodep = QUtil::make_shared_array<wchar_t>(strlen(mode) + 1);
    wchar_t* wmode = wmodep.get();
    wmode[strlen(mode)] = 0;
    for (size_t i = 0; i < strlen(mode); ++i) {
        wmode[i] = static_cast<wchar_t>(mode[i]);
    }

# ifdef _MSC_VER
    errno_t err = _wfopen_s(&f, wfilename, wmode);
    if (err != 0) {
        errno = err;
    }
# else
    f = _wfopen(wfilename, wmode);
# endif
    if (f == 0) {
        throw_system_error(std::string("open ") + filename);
    }
#else
    f = fopen_wrapper(std::string("open ") + filename, fopen(filename, mode));
#endif
    return f;
}